

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

SVInt __thiscall
slang::ast::slicePacked
          (ast *this,PackIterator *iter,PackIterator iterEnd,bitwidth_t *bit,bitwidth_t width)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  bitwidth_t bVar4;
  bitwidth_t bVar5;
  uint *puVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar7;
  SVInt SVar8;
  bitwidth_t local_a8;
  uint local_a4;
  uint local_a0;
  int local_9c;
  bitwidth_t lsb;
  bitwidth_t msb;
  SVInt *ci;
  ConstantValue local_80;
  undefined1 local_58 [8];
  ConstantValue cp;
  bitwidth_t width_local;
  bitwidth_t *bit_local;
  PackIterator iterEnd_local;
  PackIterator *iter_local;
  
  cp.value.
  super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  .
  super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ._36_4_ = width;
  if (*iter == iterEnd) {
    *bit = width + *bit;
    SVInt::SVInt((SVInt *)this,width,0,false);
    uVar7 = extraout_RDX;
  }
  else {
    slang::ConstantValue::ConstantValue((ConstantValue *)local_58,**iter);
    bVar3 = slang::ConstantValue::isString((ConstantValue *)local_58);
    if (bVar3) {
      slang::ConstantValue::convertToInt(&local_80,(ConstantValue *)local_58);
      slang::ConstantValue::operator=((ConstantValue *)local_58,&local_80);
      slang::ConstantValue::~ConstantValue(&local_80);
    }
    _lsb = slang::ConstantValue::integer((ConstantValue *)local_58);
    uVar1 = *bit;
    bVar4 = SVInt::getBitWidth(_lsb);
    if (bVar4 <= uVar1) {
      assert::assertFailed
                ("bit < ci.getBitWidth()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
                 ,0x12a,
                 "SVInt slang::ast::slicePacked(PackIterator &, const PackIterator, bitwidth_t &, bitwidth_t)"
                );
    }
    bVar4 = SVInt::getBitWidth(_lsb);
    local_9c = ~*bit + bVar4;
    local_a4 = *bit + cp.value.
                      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      ._36_4_;
    local_a8 = SVInt::getBitWidth(_lsb);
    puVar6 = std::min<unsigned_int>(&local_a4,&local_a8);
    local_a0 = *puVar6;
    bVar4 = SVInt::getBitWidth(_lsb);
    local_a0 = bVar4 - local_a0;
    *bit = (local_9c - local_a0) + 1 + *bit;
    uVar1 = *bit;
    bVar4 = SVInt::getBitWidth(_lsb);
    if (bVar4 < uVar1) {
      assert::assertFailed
                ("bit <= ci.getBitWidth()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
                 ,0x130,
                 "SVInt slang::ast::slicePacked(PackIterator &, const PackIterator, bitwidth_t &, bitwidth_t)"
                );
    }
    bVar4 = *bit;
    bVar5 = SVInt::getBitWidth(_lsb);
    iVar2 = local_9c;
    if (bVar4 == bVar5) {
      *iter = *iter + 1;
      *bit = 0;
    }
    if ((local_a0 == 0) && (bVar4 = SVInt::getBitWidth(_lsb), iVar2 == bVar4 - 1)) {
      SVInt::SVInt((SVInt *)this,_lsb);
    }
    else {
      SVInt::slice((SVInt *)this,(int32_t)_lsb,local_9c);
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)local_58);
    uVar7 = extraout_RDX_00;
  }
  SVar8.super_SVIntStorage.bitWidth = (int)uVar7;
  SVar8.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar7 >> 0x20);
  SVar8.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar7 >> 0x28);
  SVar8.super_SVIntStorage._14_2_ = (short)((ulong)uVar7 >> 0x30);
  SVar8.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar8.super_SVIntStorage;
}

Assistant:

static SVInt slicePacked(PackIterator& iter, const PackIterator iterEnd, bitwidth_t& bit,
                         bitwidth_t width) {
    if (iter == iterEnd) {
        // Only for implicit streaming concatenation conversion
        bit += width;                  // Informs the caller how many zeros are appended.
        return SVInt(width, 0, false); // filling with zero bits on the right
    }

    ConstantValue cp = **iter;
    if (cp.isString())
        cp = cp.convertToInt();

    auto& ci = cp.integer();
    ASSERT(bit < ci.getBitWidth());
    bitwidth_t msb = ci.getBitWidth() - bit - 1;
    bitwidth_t lsb = std::min(bit + width, ci.getBitWidth());
    lsb = ci.getBitWidth() - lsb;
    bit += msb - lsb + 1;

    ASSERT(bit <= ci.getBitWidth());
    if (bit == ci.getBitWidth()) {
        iter++;
        bit = 0;
    }

    if (lsb == 0 && msb == ci.getBitWidth() - 1)
        return std::move(ci);

    return ci.slice(static_cast<int32_t>(msb), static_cast<int32_t>(lsb));
}